

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

int demo_button_proc(DEMO_MENU *item,int msg,int extra)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  int iVar2;
  ALLEGRO_COLOR col;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  DEMO_MENU *in_stack_ffffffffffffffc8;
  ALLEGRO_FONT *local_28;
  int local_20;
  
  if (in_ESI == 1) {
    if ((*(uint *)(in_RDI + 0x10) & 2) == 0) {
      local_28 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff);
      _local_20 = _iVar2;
    }
    else {
      local_28 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff,0);
      _local_20 = _iVar2;
    }
    shadow_textprintf(local_28,_local_20,(int)demo_data[1].dat,(ulong)(uint)(screen_width / 2),
                      (int)(ulong)in_EDX,(char *)0x2,*(undefined8 *)(in_RDI + 8));
  }
  else if (in_ESI == 2) {
    if ((in_EDX == 0xd) || (in_EDX == 0x20)) {
      if (*(long *)(in_RDI + 0x20) != 0) {
        (**(code **)(in_RDI + 0x20))(in_RDI);
      }
      play_sound_id(in_EDX,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                    in_stack_ffffffffffffffa8,0);
      return *(int *)(in_RDI + 0x14);
    }
  }
  else if ((in_ESI == 4) || (in_ESI == 5)) {
    iVar1 = demo_text_proc(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)
                           ,(int)in_stack_ffffffffffffffc0);
    return iVar1;
  }
  return 1000;
}

Assistant:

int demo_button_proc(DEMO_MENU * item, int msg, int extra)
{
   ALLEGRO_COLOR col;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      shadow_textprintf(demo_font, screen_width / 2,
                      extra, col, 2, item->name);
   } else if (msg == DEMO_MENU_MSG_CHAR) {
      switch (extra) {
         case 13:
         case 32:
            if (item->on_activate) {
               item->on_activate(item);
            }

            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            return item->extra;
            break;
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH || msg == DEMO_MENU_MSG_HEIGHT) {
      return demo_text_proc(item, msg, extra);
   }

   return DEMO_MENU_CONTINUE;
}